

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidateDataStructure.cpp
# Opt level: O3

void __thiscall Assimp::ValidateDSProcess::Execute(ValidateDSProcess *this,aiScene *pScene)

{
  aiMesh **ppaVar1;
  aiMesh *pMesh;
  aiAnimation **ppaVar2;
  aiTexture **ppaVar3;
  aiMaterial **ppaVar4;
  Logger *pLVar5;
  char *pcVar6;
  ValidateDSProcess *this_00;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  
  this->mScene = pScene;
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"ValidateDataStructureProcess begin");
  this_00 = this;
  Validate(this,pScene->mRootNode);
  uVar9 = (ulong)pScene->mNumMeshes;
  if (uVar9 == 0) {
    if ((this->mScene->mFlags & 1) == 0) {
      pcVar6 = "aiScene::mNumMeshes is 0. At least one mesh must be there";
      goto LAB_0013d010;
    }
    if (pScene->mMeshes != (aiMesh **)0x0) {
      pcVar6 = "aiScene::mMeshes is non-null although there are no meshes";
      goto LAB_0013d010;
    }
  }
  else {
    ppaVar1 = pScene->mMeshes;
    if (ppaVar1 == (aiMesh **)0x0) {
      pcVar7 = "mMeshes";
      pcVar6 = "mNumMeshes";
      goto LAB_0013cfc9;
    }
    uVar8 = 0;
    do {
      pMesh = ppaVar1[uVar8];
      if (pMesh == (aiMesh *)0x0) {
        pcVar6 = "mMeshes";
        pcVar7 = "mNumMeshes";
        goto LAB_0013cf65;
      }
      this_00 = this;
      Validate(this,pMesh);
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  uVar9 = (ulong)pScene->mNumAnimations;
  ppaVar2 = pScene->mAnimations;
  if (uVar9 == 0) {
    if (ppaVar2 != (aiAnimation **)0x0) {
      pcVar6 = "aiScene::mAnimations is non-null although there are no animations";
      goto LAB_0013d010;
    }
  }
  else {
    if (ppaVar2 == (aiAnimation **)0x0) {
      pcVar7 = "mAnimations";
      pcVar6 = "mNumAnimations";
      goto LAB_0013cfc9;
    }
    uVar8 = 0;
    do {
      if (ppaVar2[uVar8] == (aiAnimation *)0x0) {
        pcVar6 = "mAnimations";
        pcVar7 = "mNumAnimations";
        goto LAB_0013cf65;
      }
      this_00 = this;
      Validate(this,ppaVar2[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  if (pScene->mNumCameras == 0) {
    if (pScene->mCameras != (aiCamera **)0x0) {
      pcVar6 = "aiScene::mCameras is non-null although there are no cameras";
      goto LAB_0013d010;
    }
  }
  else {
    this_00 = this;
    DoValidationWithNameCheck<aiCamera>
              (this,pScene->mCameras,pScene->mNumCameras,"mCameras","mNumCameras");
  }
  if (pScene->mNumLights == 0) {
    if (pScene->mLights != (aiLight **)0x0) {
      pcVar6 = "aiScene::mLights is non-null although there are no lights";
      goto LAB_0013d010;
    }
  }
  else {
    this_00 = this;
    DoValidationWithNameCheck<aiLight>
              (this,pScene->mLights,pScene->mNumLights,"mLights","mNumLights");
  }
  uVar9 = (ulong)pScene->mNumTextures;
  ppaVar3 = pScene->mTextures;
  if (uVar9 == 0) {
    if (ppaVar3 != (aiTexture **)0x0) {
      pcVar6 = "aiScene::mTextures is non-null although there are no textures";
      goto LAB_0013d010;
    }
  }
  else {
    if (ppaVar3 == (aiTexture **)0x0) {
      pcVar7 = "mTextures";
      pcVar6 = "mNumTextures";
      goto LAB_0013cfc9;
    }
    uVar8 = 0;
    do {
      if (ppaVar3[uVar8] == (aiTexture *)0x0) {
        pcVar6 = "mTextures";
        pcVar7 = "mNumTextures";
        goto LAB_0013cf65;
      }
      Validate(this_00,ppaVar3[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  uVar9 = (ulong)pScene->mNumMaterials;
  ppaVar4 = pScene->mMaterials;
  if (uVar9 == 0) {
    if (ppaVar4 != (aiMaterial **)0x0) {
      pcVar6 = "aiScene::mMaterials is non-null although there are no materials";
LAB_0013d010:
      ReportError(this_00,pcVar6);
    }
  }
  else {
    if (ppaVar4 == (aiMaterial **)0x0) {
      pcVar7 = "mMaterials";
      pcVar6 = "mNumMaterials";
LAB_0013cfc9:
      ReportError(this_00,"aiScene::%s is NULL (aiScene::%s is %i)",pcVar7,pcVar6,uVar9);
    }
    uVar8 = 0;
    do {
      if (ppaVar4[uVar8] == (aiMaterial *)0x0) {
        pcVar6 = "mMaterials";
        pcVar7 = "mNumMaterials";
LAB_0013cf65:
        ReportError(this_00,"aiScene::%s[%i] is NULL (aiScene::%s is %i)",pcVar6,uVar8 & 0xffffffff,
                    pcVar7,uVar9);
      }
      this_00 = this;
      Validate(this,ppaVar4[uVar8]);
      uVar8 = uVar8 + 1;
    } while (uVar9 != uVar8);
  }
  pLVar5 = DefaultLogger::get();
  Logger::debug(pLVar5,"ValidateDataStructureProcess end");
  return;
}

Assistant:

void ValidateDSProcess::Execute( aiScene* pScene) {
    mScene = pScene;
    ASSIMP_LOG_DEBUG("ValidateDataStructureProcess begin");

    // validate the node graph of the scene
    Validate(pScene->mRootNode);

    // validate all meshes
    if (pScene->mNumMeshes) {
        DoValidation(pScene->mMeshes,pScene->mNumMeshes,"mMeshes","mNumMeshes");
    }
    else if (!(mScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE)) {
        ReportError("aiScene::mNumMeshes is 0. At least one mesh must be there");
    }
    else if (pScene->mMeshes)   {
        ReportError("aiScene::mMeshes is non-null although there are no meshes");
    }

    // validate all animations
    if (pScene->mNumAnimations) {
        DoValidation(pScene->mAnimations,pScene->mNumAnimations,
            "mAnimations","mNumAnimations");
    }
    else if (pScene->mAnimations)   {
        ReportError("aiScene::mAnimations is non-null although there are no animations");
    }

    // validate all cameras
    if (pScene->mNumCameras) {
        DoValidationWithNameCheck(pScene->mCameras,pScene->mNumCameras,
            "mCameras","mNumCameras");
    }
    else if (pScene->mCameras)  {
        ReportError("aiScene::mCameras is non-null although there are no cameras");
    }

    // validate all lights
    if (pScene->mNumLights) {
        DoValidationWithNameCheck(pScene->mLights,pScene->mNumLights,
            "mLights","mNumLights");
    }
    else if (pScene->mLights)   {
        ReportError("aiScene::mLights is non-null although there are no lights");
    }

    // validate all textures
    if (pScene->mNumTextures) {
        DoValidation(pScene->mTextures,pScene->mNumTextures,
            "mTextures","mNumTextures");
    }
    else if (pScene->mTextures) {
        ReportError("aiScene::mTextures is non-null although there are no textures");
    }

    // validate all materials
    if (pScene->mNumMaterials) {
        DoValidation(pScene->mMaterials,pScene->mNumMaterials,"mMaterials","mNumMaterials");
    }
#if 0
    // NOTE: ScenePreprocessor generates a default material if none is there
    else if (!(mScene->mFlags & AI_SCENE_FLAGS_INCOMPLETE)) {
        ReportError("aiScene::mNumMaterials is 0. At least one material must be there");
    }
#endif
    else if (pScene->mMaterials)    {
        ReportError("aiScene::mMaterials is non-null although there are no materials");
    }

//  if (!has)ReportError("The aiScene data structure is empty");
    ASSIMP_LOG_DEBUG("ValidateDataStructureProcess end");
}